

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O1

void * __thiscall llvm::MallocAllocator::Allocate(MallocAllocator *this,size_t Size,size_t param_2)

{
  void *pvVar1;
  
  pvVar1 = malloc(Size);
  if (pvVar1 == (void *)0x0) {
    if ((Size == 0) && (pvVar1 = malloc(1), pvVar1 != (void *)0x0)) {
      return pvVar1;
    }
    report_bad_alloc_error("Allocation failed",true);
  }
  return pvVar1;
}

Assistant:

LLVM_ATTRIBUTE_RETURNS_NONNULL void *Allocate(size_t Size,
                                                size_t /*Alignment*/) {
    return safe_malloc(Size);
  }